

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames__channels_only
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_result mVar1;
  ma_uint32 mVar2;
  uint uVar3;
  void *in_RCX;
  undefined8 *in_RDX;
  ma_channel_converter *in_RSI;
  ma_format *in_RDI;
  undefined8 *in_R8;
  ma_uint32 tempBufferInCap;
  ma_uint8 pTempBufferIn [4096];
  ma_uint64 frameCountThisIteration;
  void *pFramesOutThisIteration;
  void *pFramesInThisIteration;
  ma_uint32 tempBufferOutCap;
  ma_uint8 pTempBufferOut [4096];
  ma_uint64 framesProcessed;
  ma_uint64 frameCount;
  ma_uint64 frameCountOut;
  ma_uint64 frameCountIn;
  ma_result result;
  ma_uint32 in_stack_ffffffffffffdf1c;
  ma_uint64 in_stack_ffffffffffffdf20;
  void *in_stack_ffffffffffffdf28;
  void *in_stack_ffffffffffffdf30;
  void *in_stack_ffffffffffffdf38;
  ma_channel_converter *in_stack_ffffffffffffdf40;
  void *local_20b8;
  ma_dither_mode in_stack_ffffffffffffdf50;
  undefined1 local_20a8 [4096];
  ulong local_10a8;
  void *local_10a0;
  ma_format *local_1098;
  uint local_108c;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  ma_result local_64;
  undefined8 *local_60;
  void *local_58;
  undefined8 *local_50;
  ma_channel_converter *local_48;
  ma_format *local_40;
  undefined8 local_30;
  undefined1 *local_28;
  ma_format local_20;
  ma_format local_1c;
  ma_format local_18;
  ma_format local_14;
  ma_format local_10;
  ma_format local_c;
  ma_format local_8;
  ma_format local_4;
  
  local_70 = (void *)0x0;
  if (in_RDX != (undefined8 *)0x0) {
    local_70 = (void *)*in_RDX;
  }
  local_78 = (void *)0x0;
  if (in_R8 != (undefined8 *)0x0) {
    local_78 = (void *)*in_R8;
  }
  if (local_70 < local_78) {
    local_20b8 = local_70;
  }
  else {
    local_20b8 = local_78;
  }
  local_80 = local_20b8;
  local_60 = in_R8;
  local_50 = in_RDX;
  if (((char)in_RDI[0x4a] == ma_format_unknown) && (*(byte *)((long)in_RDI + 0x129) == 0)) {
    mVar1 = ma_channel_converter_process_pcm_frames
                      (in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38,in_stack_ffffffffffffdf30
                       ,(ma_uint64)in_stack_ffffffffffffdf28);
    if (mVar1 != MA_SUCCESS) {
      return mVar1;
    }
  }
  else {
    local_58 = in_RCX;
    local_48 = in_RSI;
    local_40 = in_RDI;
    for (local_88 = (void *)0x0; local_88 < local_80;
        local_88 = (void *)(local_10a8 + (long)local_88)) {
      local_4 = local_40[8];
      local_8 = local_40[10];
      mVar2 = ma_get_bytes_per_sample(local_4);
      local_108c = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar2 * local_8),0);
      if (local_48 == (ma_channel_converter *)0x0) {
        local_1098 = (ma_format *)0x0;
      }
      else {
        local_c = *local_40;
        local_10 = local_40[2];
        in_stack_ffffffffffffdf38 = local_88;
        in_stack_ffffffffffffdf40 = local_48;
        mVar2 = ma_get_bytes_per_sample(local_c);
        local_1098 = (ma_format *)
                     ((long)&in_stack_ffffffffffffdf40->format +
                     (long)in_stack_ffffffffffffdf38 * (ulong)(mVar2 * local_10));
      }
      if (local_58 == (void *)0x0) {
        local_10a0 = (void *)0x0;
      }
      else {
        local_14 = local_40[1];
        local_18 = local_40[3];
        in_stack_ffffffffffffdf28 = local_88;
        in_stack_ffffffffffffdf30 = local_58;
        mVar2 = ma_get_bytes_per_sample(local_14);
        local_10a0 = (void *)((long)in_stack_ffffffffffffdf30 +
                             (long)in_stack_ffffffffffffdf28 * (ulong)(mVar2 * local_18));
      }
      if ((char)local_40[0x4a] == ma_format_unknown) {
        local_10a8 = (long)local_80 - (long)local_88;
        if (local_108c < local_10a8) {
          local_10a8 = (ulong)local_108c;
        }
        mVar1 = ma_channel_converter_process_pcm_frames
                          (in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38,
                           in_stack_ffffffffffffdf30,(ma_uint64)in_stack_ffffffffffffdf28);
        if (mVar1 != MA_SUCCESS) break;
        local_64 = MA_SUCCESS;
      }
      else {
        local_1c = local_40[8];
        local_20 = local_40[9];
        mVar2 = ma_get_bytes_per_sample(local_1c);
        uVar3 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar2 * local_20),0);
        local_10a8 = (long)local_80 - (long)local_88;
        if (uVar3 < local_10a8) {
          local_10a8 = (ulong)uVar3;
        }
        if ((*(byte *)((long)local_40 + 0x129) != 0) && (local_108c < local_10a8)) {
          local_10a8 = (ulong)local_108c;
        }
        if (local_1098 == (ma_format *)0x0) {
          local_28 = local_20a8;
          local_30 = 0x1000;
          if (local_28 != (undefined1 *)0x0) {
            memset(local_28,0,0x1000);
          }
        }
        else {
          ma_convert_pcm_frames_format
                    (in_stack_ffffffffffffdf40,(ma_format)((ulong)in_stack_ffffffffffffdf38 >> 0x20)
                     ,in_stack_ffffffffffffdf30,
                     (ma_format)((ulong)in_stack_ffffffffffffdf28 >> 0x20),in_stack_ffffffffffffdf20
                     ,in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf50);
        }
        if (*(byte *)((long)local_40 + 0x129) == 0) {
          local_64 = ma_channel_converter_process_pcm_frames
                               (in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38,
                                in_stack_ffffffffffffdf30,(ma_uint64)in_stack_ffffffffffffdf28);
        }
        else {
          local_64 = ma_channel_converter_process_pcm_frames
                               (in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38,
                                in_stack_ffffffffffffdf30,(ma_uint64)in_stack_ffffffffffffdf28);
        }
        if (local_64 != MA_SUCCESS) break;
      }
      if ((*(byte *)((long)local_40 + 0x129) != 0) && (local_10a0 != (void *)0x0)) {
        ma_convert_pcm_frames_format
                  (in_stack_ffffffffffffdf40,(ma_format)((ulong)in_stack_ffffffffffffdf38 >> 0x20),
                   in_stack_ffffffffffffdf30,(ma_format)((ulong)in_stack_ffffffffffffdf28 >> 0x20),
                   in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf1c,in_stack_ffffffffffffdf50);
      }
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    *local_50 = local_80;
  }
  if (local_60 != (undefined8 *)0x0) {
    *local_60 = local_80;
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_result result;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 frameCount;

    MA_ASSERT(pConverter != NULL);

    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    frameCount = ma_min(frameCountIn, frameCountOut);

    if (pConverter->hasPreFormatConversion == MA_FALSE && pConverter->hasPostFormatConversion == MA_FALSE) {
        /* No format conversion required. */
        result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOut, pFramesIn, frameCount);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        /* Format conversion required. */
        ma_uint64 framesProcessed = 0;

        while (framesProcessed < frameCount) {
            ma_uint8 pTempBufferOut[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
            const ma_uint32 tempBufferOutCap = sizeof(pTempBufferOut) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsOut);
            const void* pFramesInThisIteration;
            /* */ void* pFramesOutThisIteration;
            ma_uint64 frameCountThisIteration;

            if (pFramesIn != NULL) {
                pFramesInThisIteration = ma_offset_ptr(pFramesIn, framesProcessed * ma_get_bytes_per_frame(pConverter->formatIn, pConverter->channelsIn));
            } else {
                pFramesInThisIteration = NULL;
            }

            if (pFramesOut != NULL) {
                pFramesOutThisIteration = ma_offset_ptr(pFramesOut, framesProcessed * ma_get_bytes_per_frame(pConverter->formatOut, pConverter->channelsOut));
            } else {
                pFramesOutThisIteration = NULL;
            }

            /* Do a pre format conversion if necessary. */
            if (pConverter->hasPreFormatConversion) {
                ma_uint8 pTempBufferIn[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                const ma_uint32 tempBufferInCap = sizeof(pTempBufferIn) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsIn);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferInCap) {
                    frameCountThisIteration = tempBufferInCap;
                }

                if (pConverter->hasPostFormatConversion) {
                    if (frameCountThisIteration > tempBufferOutCap) {
                        frameCountThisIteration = tempBufferOutCap;
                    }
                }

                if (pFramesInThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pTempBufferIn, pConverter->channelConverter.format, pFramesInThisIteration, pConverter->formatIn, frameCountThisIteration, pConverter->channelsIn, pConverter->ditherMode);
                } else {
                    MA_ZERO_MEMORY(pTempBufferIn, sizeof(pTempBufferIn));
                }

                if (pConverter->hasPostFormatConversion) {
                    /* Both input and output conversion required. Output to the temp buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pTempBufferIn, frameCountThisIteration);
                } else {
                    /* Only pre-format required. Output straight to the output buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOutThisIteration, pTempBufferIn, frameCountThisIteration);
                }

                if (result != MA_SUCCESS) {
                    break;
                }
            } else {
                /* No pre-format required. Just read straight from the input buffer. */
                MA_ASSERT(pConverter->hasPostFormatConversion == MA_TRUE);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferOutCap) {
                    frameCountThisIteration = tempBufferOutCap;
                }

                result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pFramesInThisIteration, frameCountThisIteration);
                if (result != MA_SUCCESS) {
                    break;
                }
            }

            /* If we are doing a post format conversion we need to do that now. */
            if (pConverter->hasPostFormatConversion) {
                if (pFramesOutThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pFramesOutThisIteration, pConverter->formatOut, pTempBufferOut, pConverter->channelConverter.format, frameCountThisIteration, pConverter->channelConverter.channelsOut, pConverter->ditherMode);
                }
            }

            framesProcessed += frameCountThisIteration;
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = frameCount;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = frameCount;
    }

    return MA_SUCCESS;
}